

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mstring.c
# Opt level: O2

int strnscmp(char *a,char *b)

{
  char *pcVar1;
  byte *pbVar2;
  ushort *puVar3;
  ushort **ppuVar4;
  char cVar5;
  ulong uVar6;
  char cVar7;
  
  ppuVar4 = __ctype_b_loc();
  puVar3 = *ppuVar4;
  do {
    while( true ) {
      a = a + -1;
      do {
        uVar6 = (ulong)a[1];
        a = a + 1;
      } while ((*(byte *)((long)puVar3 + uVar6 * 2 + 1) & 0x20) != 0);
      b = b + -1;
      do {
        pcVar1 = b + 1;
        b = b + 1;
      } while ((*(byte *)((long)puVar3 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
      while ((cVar5 = (char)uVar6, cVar5 != '\0' && (cVar5 == *b))) {
        b = b + 1;
        pbVar2 = (byte *)(a + 1);
        a = a + 1;
        uVar6 = (ulong)*pbVar2;
      }
      if ((puVar3[cVar5] >> 0xd & 1) != 0) break;
      cVar7 = *b;
      if (((*(byte *)((long)puVar3 + (long)cVar7 * 2 + 1) & 0x20) == 0) ||
         (((puVar3[cVar5] & 8) != 0 && ((puVar3[b[-1]] & 8) != 0)))) goto LAB_00111fb7;
    }
  } while (((puVar3[a[-1]] & 8) == 0) || (cVar7 = *b, (puVar3[cVar7] & 8) == 0));
LAB_00111fb7:
  return (int)cVar5 - (int)cVar7;
}

Assistant:

int strnscmp(const char *a, const char *b)
{
    while(1) {
	while (isspace(*a)) a++;
	while (isspace(*b)) b++;
	while (*a && *a == *b) a++,b++;
	if (isspace(*a)) {
	    if (isalnum(a[-1]) && isalnum(*b))
		break; }
	else if (isspace(*b)) {
	    if (isalnum(b[-1]) && isalnum(*a))
		break; }
	else
	    break; }
    return *a - *b;
}